

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O2

void __thiscall r_exec::_Mem::pack_hlp(_Mem *this,Code *hlp)

{
  _func_int *p_Var1;
  byte bVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  int in_ECX;
  void *in_RDX;
  uint16_t i;
  ushort uVar11;
  void *in_R8;
  ulong uVar12;
  uint16_t i_1;
  bool bVar13;
  Atom t_atom;
  undefined4 uStack_94;
  uint16_t extent_index;
  byte local_89;
  _Mem *local_88;
  Atom local_80 [4];
  int local_7c;
  vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> references;
  ushort local_60;
  vector<r_code::Atom,_std::allocator<r_code::Atom>_> trailing_code;
  
  local_88 = this;
  iVar6 = clone(this,(__fn *)hlp,in_RDX,in_ECX,in_R8);
  trailing_code.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  trailing_code.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  trailing_code.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(hlp->super__Object)._vptr__Object[4])(hlp,3);
  uVar4 = r_code::Atom::asIndex();
  while( true ) {
    iVar7 = (*(hlp->super__Object)._vptr__Object[6])(hlp);
    p_Var1 = (hlp->super__Object)._vptr__Object[4];
    if ((ushort)iVar7 <= uVar4) break;
    iVar7 = (*p_Var1)(hlp,(ulong)uVar4);
    std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::push_back
              (&trailing_code,(value_type *)CONCAT44(extraout_var_00,iVar7));
    uVar4 = uVar4 + 1;
  }
  (*p_Var1)(hlp,5);
  iVar7 = r_code::Atom::asIndex();
  (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)(ushort)iVar7);
  bVar2 = r_code::Atom::getAtomCount();
  references.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  references.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  references.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(hlp->super__Object)._vptr__Object[4])(hlp,2);
  uVar8 = r_code::Atom::asIndex();
  local_89 = bVar2;
  local_7c = iVar7;
  (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)uVar8 & 0xffff);
  bVar2 = r_code::Atom::getAtomCount();
  extent_index = (ushort)bVar2 + (short)uVar8 + 1;
  for (uVar4 = 0; iVar7 = local_7c, local_60 = (ushort)bVar2, uVar11 = (ushort)&t_atom,
      local_60 != uVar4; uVar4 = uVar4 + 1) {
    iVar7 = (*(hlp->super__Object)._vptr__Object[9])(hlp,(ulong)uVar4);
    r_code::Atom::IPointer(uVar11);
    iVar9 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)(ushort)(uVar4 + (short)uVar8 + 1));
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar9),&t_atom);
    r_code::Atom::~Atom(&t_atom);
    pack_fact(local_88,(Code *)CONCAT44(extraout_var_01,iVar7),hlp,&extent_index,&references);
  }
  local_88 = (_Mem *)(ulong)extent_index;
  uVar12 = 0;
  do {
    uVar12 = uVar12 & 0xffff;
    if ((ulong)((long)trailing_code.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)trailing_code.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar12) {
      (*(hlp->super__Object)._vptr__Object[4])(hlp,3);
      r_code::Atom::asIndex();
      r_code::Atom::IPointer(uVar11);
      iVar9 = (*(hlp->super__Object)._vptr__Object[4])(hlp,3);
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar9),&t_atom);
      r_code::Atom::~Atom(&t_atom);
      (*(hlp->super__Object)._vptr__Object[4])(hlp,4);
      r_code::Atom::asIndex();
      r_code::Atom::IPointer(uVar11);
      iVar9 = (*(hlp->super__Object)._vptr__Object[4])(hlp,4);
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar9),&t_atom);
      r_code::Atom::~Atom(&t_atom);
      (*(hlp->super__Object)._vptr__Object[4])(hlp,5);
      r_code::Atom::asIndex();
      r_code::Atom::IPointer(uVar11);
      iVar9 = (*(hlp->super__Object)._vptr__Object[4])(hlp,5);
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar9),&t_atom);
      r_code::Atom::~Atom(&t_atom);
      uVar4 = (ushort)local_89;
      uVar8 = ((iVar7 + (int)local_88) - uVar8) - (uint)local_60;
      while (bVar13 = uVar4 != 0, uVar4 = uVar4 - 1, bVar13) {
        (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)(uVar8 & 0xffff));
        uVar5 = r_code::Atom::asIndex();
        iVar7 = (*(hlp->super__Object)._vptr__Object[9])(hlp,(ulong)uVar5);
        _t_atom = CONCAT44(extraout_var_09,iVar7);
        if (_t_atom != 0) {
          LOCK();
          *(long *)(_t_atom + 8) = *(long *)(_t_atom + 8) + 1;
          UNLOCK();
        }
        std::vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>>::
        emplace_back<core::P<r_code::Code>>
                  ((vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *)
                   &references,(P<r_code::Code> *)&t_atom);
        core::P<r_code::Code>::~P((P<r_code::Code> *)&t_atom);
        r_code::Atom::RPointer(uVar11);
        iVar7 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)(uVar8 & 0xffff));
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_10,iVar7),&t_atom);
        r_code::Atom::~Atom(&t_atom);
        uVar8 = uVar8 + 1;
      }
      (*(hlp->super__Object)._vptr__Object[0xc])(hlp,&references);
      (*(hlp->super__Object)._vptr__Object[0x19])(hlp,CONCAT44(extraout_var,iVar6));
      std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::~vector
                (&references);
      std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::~vector(&trailing_code);
      return;
    }
    _t_atom = CONCAT44(uStack_94,
                       *(undefined4 *)
                        (trailing_code.
                         super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar12 * 4));
    cVar3 = r_code::Atom::getDescriptor();
    iVar9 = (int)uVar12;
    if (cVar3 == -0x7c) {
      r_code::Atom::asIndex();
      r_code::Atom::IPointer((ushort)local_80);
      iVar10 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)((int)local_88 + iVar9 & 0xffff))
      ;
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar10),local_80);
LAB_00198acc:
      r_code::Atom::~Atom(local_80);
    }
    else {
      if (cVar3 == -0x73) {
        uVar4 = r_code::Atom::asAssignmentIndex();
        r_code::Atom::asIndex();
        r_code::Atom::AssignmentPointer((uchar)local_80,uVar4 & 0xff);
        iVar10 = (*(hlp->super__Object)._vptr__Object[4])
                           (hlp,(ulong)((int)local_88 + iVar9 & 0xffff));
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar10),local_80);
        goto LAB_00198acc;
      }
      iVar10 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)((int)local_88 + iVar9 & 0xffff))
      ;
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar10),&t_atom);
    }
    r_code::Atom::~Atom(&t_atom);
    uVar12 = (ulong)(iVar9 + 1);
  } while( true );
}

Assistant:

void _Mem::pack_hlp(Code *hlp) const   // produces a new object where a set of pattern objects is transformed into a packed set of pattern code.
{
    Code *unpacked_hlp = clone(hlp);
    std::vector<Atom> trailing_code; // copy of the original code (the latter will be overwritten by packed facts).
    uint16_t trailing_code_index = hlp->code(HLP_FWD_GUARDS).asIndex();

    for (uint16_t i = trailing_code_index; i < hlp->code_size(); ++i) {
        trailing_code.push_back(hlp->code(i));
    }

    uint16_t group_set_index = hlp->code(HLP_OUT_GRPS).asIndex();
    uint16_t group_count = hlp->code(group_set_index).getAtomCount();
    std::vector<P<Code> > references;
    uint16_t pattern_set_index = hlp->code(HLP_OBJS).asIndex();
    uint16_t pattern_count = hlp->code(pattern_set_index).getAtomCount();
    uint16_t insertion_point = pattern_set_index + pattern_count + 1; // point from where compacted code is to be inserted.
    uint16_t extent_index = insertion_point;

    for (uint16_t i = 0; i < pattern_count; ++i) {
        Code *pattern_object = hlp->get_reference(i);
        hlp->code(pattern_set_index + i + 1) = Atom::IPointer(extent_index);
        pack_fact(pattern_object, hlp, extent_index, &references);
    }

    uint16_t inserted_zone_length = extent_index - insertion_point;

    for (uint16_t i = 0; i < trailing_code.size(); ++i) { // shift the trailing code downward; adjust i-ptrs.
        Atom t_atom = trailing_code[i];

        switch (t_atom.getDescriptor()) {
        case Atom::I_PTR:
            hlp->code(i + extent_index) = Atom::IPointer(t_atom.asIndex() + inserted_zone_length);
            break;

        case Atom::ASSIGN_PTR:
            hlp->code(i + extent_index) = Atom::AssignmentPointer(t_atom.asAssignmentIndex(), t_atom.asIndex() + inserted_zone_length);
            break;

        default:
            hlp->code(i + extent_index) = t_atom;
            break;
        }
    }

    // adjust set indices.
    hlp->code(CST_FWD_GUARDS) = Atom::IPointer(hlp->code(HLP_FWD_GUARDS).asIndex() + inserted_zone_length);
    hlp->code(CST_BWD_GUARDS) = Atom::IPointer(hlp->code(HLP_BWD_GUARDS).asIndex() + inserted_zone_length);
    hlp->code(CST_OUT_GRPS) = Atom::IPointer(hlp->code(HLP_OUT_GRPS).asIndex() + inserted_zone_length);
    group_set_index += inserted_zone_length;

    for (uint16_t i = 1; i <= group_count; ++i) { // append the out_groups to the new references; adjust the exisitng r-ptrs.
        references.push_back(hlp->get_reference(hlp->code(group_set_index + i).asIndex()));
        hlp->code(group_set_index + i) = Atom::RPointer(references.size() - 1);
    }

    hlp->set_references(references);
    hlp->add_reference(unpacked_hlp); // hidden reference.
}